

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

uint32_t av1_get_crc_value(CRC_CALCULATOR *p_crc_calculator,uint8_t *p,int length)

{
  uint uVar1;
  ulong uVar2;
  
  p_crc_calculator->remainder = 0;
  uVar1 = 0;
  for (uVar2 = 0; (uint)length != uVar2; uVar2 = uVar2 + 1) {
    uVar1 = uVar1 << 8 ^
            p_crc_calculator->table
            [(byte)((byte)(uVar1 >> ((char)p_crc_calculator->bits - 8U & 0x1f)) ^ p[uVar2])];
    p_crc_calculator->remainder = uVar1;
  }
  return uVar1 & p_crc_calculator->final_result_mask;
}

Assistant:

uint32_t av1_get_crc_value(CRC_CALCULATOR *p_crc_calculator, uint8_t *p,
                           int length) {
  crc_calculator_reset(p_crc_calculator);
  crc_calculator_process_data(p_crc_calculator, p, length);
  return crc_calculator_get_crc(p_crc_calculator);
}